

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetwork.pb.h
# Opt level: O1

GlobalPooling3DLayerParams * __thiscall
CoreML::Specification::NeuralNetworkLayer::_internal_mutable_globalpooling3d
          (NeuralNetworkLayer *this)

{
  ulong uVar1;
  GlobalPooling3DLayerParams *pGVar2;
  Arena *arena;
  
  if (this->_oneof_case_[0] != 0x5ba) {
    clear_layer(this);
    this->_oneof_case_[0] = 0x5ba;
    uVar1 = (this->super_MessageLite)._internal_metadata_.ptr_;
    arena = (Arena *)(uVar1 & 0xfffffffffffffffc);
    if ((uVar1 & 1) != 0) {
      arena = *(Arena **)arena;
    }
    pGVar2 = google::protobuf::Arena::
             CreateMaybeMessage<CoreML::Specification::GlobalPooling3DLayerParams>(arena);
    (this->layer_).globalpooling3d_ = pGVar2;
  }
  return (GlobalPooling3DLayerParams *)(this->layer_).convolution_;
}

Assistant:

inline ::CoreML::Specification::GlobalPooling3DLayerParams* NeuralNetworkLayer::_internal_mutable_globalpooling3d() {
  if (!_internal_has_globalpooling3d()) {
    clear_layer();
    set_has_globalpooling3d();
    layer_.globalpooling3d_ = CreateMaybeMessage< ::CoreML::Specification::GlobalPooling3DLayerParams >(GetArenaForAllocation());
  }
  return layer_.globalpooling3d_;
}